

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int stack_5_3::semmetry(LinkList *list,int n)

{
  bool bVar1;
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  node *local_48;
  LinkList p;
  sq_stack s;
  int local_20;
  int e;
  int a;
  int n_local;
  LinkList *list_local;
  
  local_20 = n / 2;
  init((EVP_PKEY_CTX *)&p);
  for (local_48 = (*list)->next; local_48 != (node *)0x0 && 0 < local_20; local_48 = local_48->next)
  {
    push((sq_stack *)&p,local_48->data);
    local_20 = local_20 + -1;
  }
  if (n % 2 != 0) {
    local_48 = local_48->next;
  }
  pop((sq_stack *)&p,(int *)&s.field_0x14);
  while( true ) {
    bVar1 = false;
    if (local_48 != (node *)0x0) {
      bVar1 = s._20_4_ == local_48->data;
    }
    if (!bVar1) break;
    local_48 = local_48->next;
    pop((sq_stack *)&p,(int *)&s.field_0x14);
  }
  if ((s.data._4_4_ == 0) && (local_48 == (node *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,anon_var_dwarf_7ba + 4,&local_69);
    list_local._4_4_ = errCode((string *)local_68,1);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,anon_var_dwarf_7ba,&local_a1);
    list_local._4_4_ = errCode((string *)local_a0,0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  return list_local._4_4_;
}

Assistant:

int semmetry(linklist_5_3::LinkList &list, int n) {
        int a = n / 2, e;
        sq_stack s;
        init(s);
        linklist_5_3::LinkList p = list->next;
        while (p != nullptr && a > 0) {
            push(s, p->data);
            p = p->next;
            a--;
        }
        if (n % 2 != 0)
            p = p->next;

        pop(s, e);
        while (p != nullptr && e == p->data) {
            p = p->next;
            pop(s, e);
        }

        if (s.len == 0 && p == nullptr)
            return errCode("对称", 1);
        else
            return errCode("not 对称", 0);
    }